

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O2

SharedPtr<Decorator> __thiscall
Rml::DecoratorRadialGradientInstancer::InstanceDecorator
          (DecoratorRadialGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  Array<const_Property_*,_2> p_position;
  bool bVar1;
  Shape in_shape;
  Unit UVar2;
  SizeType in_size_type;
  Property *this_00;
  Property *this_01;
  Property *this_02;
  Property *pPVar3;
  Property *pPVar4;
  Property *pPVar5;
  NumericValue NVar6;
  undefined4 uVar7;
  int iVar8;
  DecoratorInstancerInterface *pDVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  undefined1 auVar11 [16];
  Vector2Numeric in_position;
  SharedPtr<Decorator> SVar12;
  Vector2Numeric in_size;
  Property *in_stack_ffffffffffffff78;
  Property *in_stack_ffffffffffffff80;
  NumericValue local_68;
  SharedPtr<Rml::DecoratorRadialGradient> decorator;
  
  pDVar9 = param_3;
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
  uVar7 = SUB84(pDVar9,0);
  this_01 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  this_02 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  pPVar3 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xb]);
  pPVar4 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xc]);
  pPVar5 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xd]);
  auVar11._0_4_ = -(uint)((int)((ulong)this_00 >> 0x20) == 0 && (int)this_00 == 0);
  auVar11._4_4_ = -(uint)((int)this_01 == 0 && (int)((ulong)this_01 >> 0x20) == 0);
  auVar11._8_4_ = -(uint)((int)((ulong)this_02 >> 0x20) == 0 && (int)this_02 == 0);
  auVar11._12_4_ = -(uint)((int)pPVar3 == 0 && (int)((ulong)pPVar3 >> 0x20) == 0);
  iVar8 = movmskps(uVar7,auVar11);
  _Var10._M_pi = extraout_RDX;
  if ((iVar8 == 0) &&
     (_Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT71((int7)((ulong)extraout_RDX >> 8),pPVar4 != (Property *)0x0),
     pPVar4 != (Property *)0x0 && pPVar5 != (Property *)0x0)) {
    in_shape = Property::Get<int>(this_00);
    if (in_shape == Unspecified) {
      UVar2 = this_01->unit;
      if ((UVar2 & LENGTH_PERCENT) != UNKNOWN) {
        in_shape = (Shape)(this_02->unit != KEYWORD);
        goto LAB_0027421a;
      }
      in_shape = Ellipse;
    }
    else {
LAB_0027421a:
      UVar2 = this_01->unit;
      if ((in_shape == Circle) &&
         ((_Var10._M_pi = extraout_RDX_00, UVar2 == PERCENT ||
          (in_shape = Circle, this_02->unit != KEYWORD)))) goto LAB_00274330;
    }
    if (UVar2 == KEYWORD) {
      in_size_type = Property::Get<int>(this_01);
      NVar6.number = 0.0;
      NVar6.unit = UNKNOWN;
      local_68.number = 0.0;
      local_68.unit = UNKNOWN;
    }
    else {
      NVar6 = Property::GetNumericValue(this_01);
      in_size_type = LengthPercentage;
      local_68 = NVar6;
      if (this_02->unit != KEYWORD) {
        local_68 = Property::GetNumericValue(this_02);
      }
    }
    p_position._M_elems[1] = in_stack_ffffffffffffff80;
    p_position._M_elems[0] = in_stack_ffffffffffffff78;
    in_position = ComputePosition(p_position);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              properties_,"repeating-radial-gradient");
    _Var10._M_pi = extraout_RDX_01;
    if (pPVar5->unit == COLORSTOPLIST) {
      ::std::make_shared<Rml::DecoratorRadialGradient>();
      in_size.y = local_68;
      in_size.x = NVar6;
      bVar1 = DecoratorRadialGradient::Initialise
                        (decorator.
                         super___shared_ptr<Rml::DecoratorRadialGradient,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,bVar1,in_shape,in_size_type,in_size,in_position,
                         (ColorStopList *)(pPVar5->value).data);
      _Var10 = decorator.
               super___shared_ptr<Rml::DecoratorRadialGradient,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
      if (bVar1) {
        decorator.super___shared_ptr<Rml::DecoratorRadialGradient,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
             (_func_int **)
             decorator.super___shared_ptr<Rml::DecoratorRadialGradient,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var10._M_pi;
        decorator.super___shared_ptr<Rml::DecoratorRadialGradient,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
      }
      else {
        (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
        (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&decorator.
                  super___shared_ptr<Rml::DecoratorRadialGradient,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      _Var10._M_pi = extraout_RDX_02;
      goto LAB_00274339;
    }
  }
LAB_00274330:
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
  (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
  super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00274339:
  SVar12.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  SVar12.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedPtr<Decorator>)SVar12.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

SharedPtr<Decorator> DecoratorRadialGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	const Property* p_ending_shape = properties_.GetProperty(ids.ending_shape);
	const Property* p_size_x = properties_.GetProperty(ids.size_x);
	const Property* p_size_y = properties_.GetProperty(ids.size_y);
	Array<const Property*, 2> p_position = {properties_.GetProperty(ids.position_x), properties_.GetProperty(ids.position_y)};
	const Property* p_color_stop_list = properties_.GetProperty(ids.color_stop_list);

	if (!p_ending_shape || !p_size_x || !p_size_y || !p_position[0] || !p_position[1] || !p_color_stop_list)
		return nullptr;

	using SizeType = DecoratorRadialGradient::SizeType;
	using Shape = DecoratorRadialGradient::Shape;

	Shape shape = (Shape)p_ending_shape->Get<int>();
	if (shape == Shape::Unspecified)
	{
		const bool circle_sized = (Any(p_size_x->unit & Unit::LENGTH_PERCENT) && p_size_y->unit == Unit::KEYWORD);
		shape = (circle_sized ? Shape::Circle : Shape::Ellipse);
	}
	if (shape == Shape::Circle && (p_size_x->unit == Unit::PERCENT || p_size_y->unit != Unit::KEYWORD))
		return nullptr;

	SizeType size_type = {};
	Vector2Numeric size;
	if (p_size_x->unit == Unit::KEYWORD)
	{
		size_type = (SizeType)p_size_x->Get<int>();
	}
	else
	{
		size_type = SizeType::LengthPercentage;
		size.x = p_size_x->GetNumericValue();
		size.y = (p_size_y->unit == Unit::KEYWORD ? size.x : p_size_y->GetNumericValue());
	}

	const Vector2Numeric position = ComputePosition(p_position);
	const bool repeating = (name == "repeating-radial-gradient");

	if (p_color_stop_list->unit != Unit::COLORSTOPLIST)
		return nullptr;
	const ColorStopList& color_stop_list = p_color_stop_list->value.GetReference<ColorStopList>();

	auto decorator = MakeShared<DecoratorRadialGradient>();
	if (decorator->Initialise(repeating, shape, size_type, size, position, color_stop_list))
		return decorator;

	return nullptr;
}